

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O2

TestMutualRecursionA_SubGroup * __thiscall
proto2_unittest::TestMutualRecursionA::_internal_mutable_subgroup(TestMutualRecursionA *this)

{
  TestMutualRecursionA_SubGroup *pTVar1;
  Arena *arena;
  
  pTVar1 = (this->field_0)._impl_.subgroup_;
  if (pTVar1 != (TestMutualRecursionA_SubGroup *)0x0) {
    return pTVar1;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pTVar1 = (TestMutualRecursionA_SubGroup *)
           google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestMutualRecursionA_SubGroup>
                     (arena);
  (this->field_0)._impl_.subgroup_ = pTVar1;
  return pTVar1;
}

Assistant:

inline ::proto2_unittest::TestMutualRecursionA_SubGroup* PROTOBUF_NONNULL TestMutualRecursionA::_internal_mutable_subgroup() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.subgroup_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestMutualRecursionA_SubGroup>(GetArena());
    _impl_.subgroup_ = reinterpret_cast<::proto2_unittest::TestMutualRecursionA_SubGroup*>(p);
  }
  return _impl_.subgroup_;
}